

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O3

Wrench * iDynTree::getMeasuredWrench
                   (Wrench *__return_storage_ptr__,SensorsList *sensor_list,
                   SensorsMeasurements *sensor_measures,LinkIndex link_id)

{
  long lVar1;
  long lVar2;
  Wrench measured_wrench_on_link;
  Wrench measured_wrench_by_sensor;
  undefined4 local_10c;
  undefined **local_108;
  long local_100;
  Wrench *local_f8;
  SensorsMeasurements *local_f0;
  code *local_e8;
  SensorsList *local_e0;
  code *local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined **local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  long local_68 [7];
  
  local_d8 = (code *)((ulong)local_d8 & 0xffffffff00000000);
  local_f8 = (Wrench *)link_id;
  local_f0 = sensor_measures;
  local_e0 = sensor_list;
  lVar1 = iDynTree::SensorsList::getNrOfSensors((SensorType *)sensor_list);
  local_e8 = iDynTree::Wrench::operator+;
  local_d8 = iDynTree::Wrench::operator+;
  local_d0 = 0;
  uStack_c8 = 0;
  local_c0 = 0;
  uStack_b8 = 0;
  local_b0 = 0;
  uStack_a8 = 0;
  iDynTree::Wrench::Wrench(__return_storage_ptr__,(SpatialForceVector *)&local_d8);
  iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)&local_d8);
  if (lVar1 != 0) {
    lVar2 = 0;
    local_108 = &PTR__SpatialForceVector_00180a50;
    local_100 = lVar1;
    do {
      local_d8 = (code *)((ulong)local_d8 & 0xffffffff00000000);
      lVar1 = iDynTree::SensorsList::getSensor((SensorType *)local_e0,(long)&local_d8);
      local_a0 = (undefined **)local_e8;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      iDynTree::Wrench::Wrench((Wrench *)&local_d8,(SpatialForceVector *)&local_a0);
      iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)&local_a0);
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a0 = local_108;
      local_10c = 0;
      local_68[0] = lVar2;
      iDynTree::SensorsMeasurements::getMeasurement
                ((SensorType *)local_f0,(long *)&local_10c,(Wrench *)local_68);
      iDynTree::SixAxisForceTorqueSensor::getWrenchAppliedOnLink(lVar1,local_f8,(Wrench *)&local_a0)
      ;
      iDynTree::Wrench::operator+((Wrench *)local_68,__return_storage_ptr__);
      iDynTree::Wrench::operator=(__return_storage_ptr__,(Wrench *)local_68);
      iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_68);
      iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)&local_a0);
      iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)&local_d8);
      lVar2 = lVar2 + 1;
    } while (local_100 != lVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Wrench getMeasuredWrench(const SensorsList & sensor_list,
                         const SensorsMeasurements & sensor_measures,
                         const LinkIndex link_id)
{
    size_t NrOfFTSensors = sensor_list.getNrOfSensors(SIX_AXIS_FORCE_TORQUE);
    ::iDynTree::Wrench total_measured_applied_wrench = ::iDynTree::Wrench::Zero();
    for(size_t ft=0; ft < NrOfFTSensors; ft++ )
    {
        ::iDynTree::SixAxisForceTorqueSensor * sens
            = (::iDynTree::SixAxisForceTorqueSensor *) sensor_list.getSensor(::iDynTree::SIX_AXIS_FORCE_TORQUE,ft);

        assert(sens != 0);

        Wrench measured_wrench_on_link = Wrench::Zero();
        Wrench measured_wrench_by_sensor;

        bool ok = sensor_measures.getMeasurement(SIX_AXIS_FORCE_TORQUE,ft,measured_wrench_by_sensor);

        IDYNTREE_UNUSED(ok);
        assert(ok);

        // If the sensor with index ft is not attached to the link
        // this function return a zero wrench
        sens->getWrenchAppliedOnLink(link_id,measured_wrench_by_sensor,measured_wrench_on_link);

        //Sum the given wrench to the return value
        total_measured_applied_wrench = total_measured_applied_wrench+measured_wrench_on_link;
    }

    return total_measured_applied_wrench;
}